

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

Result * __thiscall CoreML::Model::save(Result *__return_storage_ptr__,Model *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream **ppoVar2;
  element_type *this_00;
  bool bVar3;
  size_type __dnew;
  OstreamOutputStream rawOutput;
  size_type local_b8;
  string local_b0;
  Result local_90;
  OstreamOutputStream local_68;
  
  if (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) == 0) {
    CoreML::downgradeSpecificationVersion
              ((this->m_spec).
               super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    validate(&local_90,
             (this->m_spec).
             super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar3 = Result::good(&local_90);
    if (!bVar3) {
      __return_storage_ptr__->m_type = local_90.m_type;
      __return_storage_ptr__->m_reason = local_90.m_reason;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.m_message._M_dataplus._M_p == &local_90.m_message.field_2) {
        paVar1->_M_allocated_capacity = local_90.m_message.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
             local_90.m_message.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_90.m_message._M_dataplus._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             local_90.m_message.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_90.m_message._M_string_length;
      return __return_storage_ptr__;
    }
    this_00 = (this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    google::protobuf::io::OstreamOutputStream::OstreamOutputStream(&local_68,out,-1);
    bVar3 = google::protobuf::MessageLite::SerializeToZeroCopyStream
                      (&this_00->super_MessageLite,&local_68.super_ZeroCopyOutputStream);
    if (bVar3) {
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_b8 = 0x1a;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b0,(ulong)&local_b8);
      local_b0.field_2._M_allocated_capacity = local_b8;
      builtin_strncpy(local_b0._M_dataplus._M_p,"unable to serialize object",0x1a);
      local_b0._M_string_length = local_b8;
      local_b0._M_dataplus._M_p[local_b8] = '\0';
      Result::Result(__return_storage_ptr__,FAILED_TO_SERIALIZE,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    google::protobuf::io::OstreamOutputStream::~OstreamOutputStream(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_message._M_dataplus._M_p == &local_90.m_message.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    ppoVar2 = &local_68.copying_output_.output_;
    local_68.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = (_func_int **)ppoVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"unable to open file for write","");
    Result::Result(__return_storage_ptr__,UNABLE_TO_OPEN_FILE,(string *)&local_68);
    local_90.m_message.field_2._M_allocated_capacity = (size_type)local_68.copying_output_.output_;
    local_90.m_message._M_dataplus._M_p =
         (pointer)local_68.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream;
    if ((ostream **)local_68.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream == ppoVar2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_90.m_message._M_dataplus._M_p,
                  (ulong)(local_90.m_message.field_2._M_allocated_capacity + 1));
  return __return_storage_ptr__;
}

Assistant:

Result Model::save(std::ostream& out) {
        if (!out.good()) {
            return Result(ResultType::UNABLE_TO_OPEN_FILE,
                          "unable to open file for write");
        }

        // Before saving the model, always downgrade the specification version to
        // the minimal version supporting everything this model needs
        downgradeSpecificationVersion();

        // validate on save
        Result r = validate();
        if (!r.good()) {
            return r;
        }
        
        return saveSpecification(*m_spec, out);
    }